

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

int resp0_sock_set_max_ttl(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  int local_34;
  int rv;
  int ttl;
  resp0_sock *s;
  size_t sStack_20;
  nni_opt_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _rv = arg;
  s._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  iVar1 = nni_copyin_int(&local_34,buf,sz,1,0xf,t);
  if (iVar1 == 0) {
    nni_atomic_set((nni_atomic_int *)((long)_rv + 0x28),local_34);
  }
  return iVar1;
}

Assistant:

static int
resp0_sock_set_max_ttl(void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	resp0_sock *s = arg;
	int         ttl;
	int         rv;

	if ((rv = nni_copyin_int(&ttl, buf, sz, 1, NNI_MAX_MAX_TTL, t)) == 0) {
		nni_atomic_set(&s->ttl, ttl);
	}
	return (rv);
}